

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O3

void __thiscall
icu_63::DateFormatSymbols::setQuarters
          (DateFormatSymbols *this,UnicodeString *quartersArray,int32_t count,DtContextType context,
          DtWidthType width)

{
  long *plVar1;
  uint uVar2;
  long lVar3;
  UnicodeString *pUVar4;
  UMemory *pUVar5;
  UnicodeString *pUVar6;
  long lVar7;
  
  if (context == STANDALONE) {
    if (width == ABBREVIATED) {
      pUVar6 = this->fStandaloneShortQuarters;
      pUVar4 = quartersArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_00487e70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fStandaloneShortQuarters = pUVar6;
      lVar3 = 0x1b0;
      if (0 < count) {
        uVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,quartersArray);
          uVar2 = uVar2 - 1;
          pUVar6 = pUVar6 + 1;
          quartersArray = quartersArray + 1;
        } while (1 < uVar2);
      }
    }
    else {
      if (width != WIDE) {
        return;
      }
      pUVar6 = this->fStandaloneQuarters;
      pUVar4 = quartersArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_00487e70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fStandaloneQuarters = pUVar6;
      lVar3 = 0x1a0;
      if (0 < count) {
        uVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,quartersArray);
          uVar2 = uVar2 - 1;
          pUVar6 = pUVar6 + 1;
          quartersArray = quartersArray + 1;
        } while (1 < uVar2);
      }
    }
  }
  else {
    if (context != FORMAT) {
      return;
    }
    if (width == ABBREVIATED) {
      pUVar6 = this->fShortQuarters;
      pUVar4 = quartersArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_00487e70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fShortQuarters = pUVar6;
      lVar3 = 400;
      if (0 < count) {
        uVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,quartersArray);
          uVar2 = uVar2 - 1;
          pUVar6 = pUVar6 + 1;
          quartersArray = quartersArray + 1;
        } while (1 < uVar2);
      }
    }
    else {
      if (width != WIDE) {
        return;
      }
      pUVar6 = this->fQuarters;
      pUVar4 = quartersArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_00487e70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fQuarters = pUVar6;
      lVar3 = 0x180;
      if (0 < count) {
        uVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,quartersArray);
          uVar2 = uVar2 - 1;
          pUVar6 = pUVar6 + 1;
          quartersArray = quartersArray + 1;
        } while (1 < uVar2);
      }
    }
  }
  *(int32_t *)((long)&(this->super_UObject)._vptr_UObject + lVar3) = count;
  return;
}

Assistant:

void
DateFormatSymbols::setQuarters(const UnicodeString* quartersArray, int32_t count, DtContextType context, DtWidthType width)
{
    // delete the old list if we own it
    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)

    switch (context) {
    case FORMAT :
        switch (width) {
        case WIDE :
            if (fQuarters)
                delete[] fQuarters;
            fQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fQuarters,count);
            fQuartersCount = count;
            break;
        case ABBREVIATED :
            if (fShortQuarters)
                delete[] fShortQuarters;
            fShortQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fShortQuarters,count);
            fShortQuartersCount = count;
            break;
        case NARROW :
        /*
            if (fNarrowQuarters)
                delete[] fNarrowQuarters;
            fNarrowQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fNarrowQuarters,count);
            fNarrowQuartersCount = count;
        */
            break;
        default :
            break;
        }
        break;
    case STANDALONE :
        switch (width) {
        case WIDE :
            if (fStandaloneQuarters)
                delete[] fStandaloneQuarters;
            fStandaloneQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fStandaloneQuarters,count);
            fStandaloneQuartersCount = count;
            break;
        case ABBREVIATED :
            if (fStandaloneShortQuarters)
                delete[] fStandaloneShortQuarters;
            fStandaloneShortQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fStandaloneShortQuarters,count);
            fStandaloneShortQuartersCount = count;
            break;
        case NARROW :
        /*
           if (fStandaloneNarrowQuarters)
                delete[] fStandaloneNarrowQuarters;
            fStandaloneNarrowQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fStandaloneNarrowQuarters,count);
            fStandaloneNarrowQuartersCount = count;
        */
            break;
        default :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
}